

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O1

bool __thiscall hwtest::pgraph::MthdEmuD3D56TexFormat::is_valid_val(MthdEmuD3D56TexFormat *this)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if (((((((uVar1 & 3) != 0) && ((uVar1 & 3) != 3)) && (uVar3 = uVar1 >> 4 & 3, uVar3 != 0)) &&
       (((uVar3 != 3 && (uVar3 = uVar1 >> 6 & 3, uVar3 != 0)) &&
        ((uVar3 != 3 && (((~uVar1 & 0xc00000) != 0 && ((uVar1 & 0xc0000) != 0xc0000)))))))) &&
      ((uVar1 & 0xf000) != 0)) &&
     (((((uVar1 & 0x700) != 0 && ((uVar1 & 0x800) == 0)) &&
       (0xfffffffffffffffb < (ulong)(uVar1 >> 0x18 & 7) - 5)) &&
      (0xfffffffffffffffb < (ulong)(uVar1 >> 0x1c & 7) - 5)))) {
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.cls;
    if ((uVar2 == 0x94) || (uVar2 == 0x54)) {
      uVar1 = uVar1 & 8;
    }
    else {
      uVar1 = uVar1 & 0xc;
    }
    if (uVar1 == 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool is_valid_val() override {
		if (!extr(val, 0, 2) || extr(val, 0, 2) == 3)
			return false;
		if (!extr(val, 4, 2) || extr(val, 4, 2) == 3)
			return false;
		if (!extr(val, 6, 2) || extr(val, 6, 2) == 3)
			return false;
		if (!extr(val, 8, 3))
			return false;
		if (extr(val, 11, 1))
			return false;
		if (!extr(val, 12, 4))
			return false;
		if (extr(val, 16, 4) > 0xb)
			return false;
		if (extr(val, 20, 4) > 0xb)
			return false;
		if (extr(val, 24, 3) < 1 || extr(val, 24, 3) > 4)
			return false;
		if (extr(val, 28, 3) < 1 || extr(val, 28, 3) > 4)
			return false;
		if (cls == 0x54 || cls == 0x94) {
			if (extr(val, 2, 2) > 1)
				return false;
		} else {
			if (extr(val, 2, 2))
				return false;;
		}
		return true;
	}